

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::MergeWallyMap
               (wally_map *src,wally_map *dst,string *item_name,bool ignore_duplicate_error)

{
  wally_map_item *pwVar1;
  size_t __n;
  uint8_t *src_00;
  uint8_t *dest;
  unsigned_long uVar2;
  bool bVar3;
  iterator iVar4;
  int iVar5;
  long *plVar6;
  CfdException *pCVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  bool bVar11;
  long lVar12;
  wally_map_item *pwVar13;
  int ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> regist_indexes;
  ByteData key;
  int local_cc;
  unsigned_long local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  uint local_9c;
  unsigned_long *local_98;
  iterator iStack_90;
  unsigned_long *local_88;
  string *local_78;
  wally_map *local_70;
  size_t local_68;
  size_t local_60;
  wally_map *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = (unsigned_long *)0x0;
  local_98 = (unsigned_long *)0x0;
  iStack_90._M_current = (unsigned_long *)0x0;
  local_c8 = 0;
  local_78 = item_name;
  if (dst->num_items != 0) {
    local_9c = (uint)ignore_duplicate_error;
    local_70 = dst;
    local_58 = src;
    do {
      if (src->num_items == 0) {
LAB_001be498:
        if (iStack_90._M_current == local_88) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,iStack_90,
                     &local_c8);
        }
        else {
          *iStack_90._M_current = local_c8;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      else {
        pwVar13 = dst->items + local_c8;
        lVar12 = 0;
        bVar11 = false;
        uVar9 = 0;
        do {
          pwVar1 = src->items;
          __n = *(size_t *)((long)&pwVar1->key_len + lVar12);
          bVar3 = true;
          if (__n == pwVar13->key_len) {
            iVar5 = bcmp(*(void **)((long)&pwVar1->key + lVar12),pwVar13->key,__n);
            if (iVar5 == 0) {
              ByteData::ByteData((ByteData *)&local_50,*(uint8_t **)((long)&pwVar1->key + lVar12),
                                 *(uint32_t *)((long)&pwVar1->key_len + lVar12));
              src_00 = *(uint8_t **)((long)&pwVar1->value + lVar12);
              local_60 = *(size_t *)((long)&pwVar1->value_len + lVar12);
              dest = pwVar13->value;
              local_68 = pwVar13->value_len;
              ByteData::GetHex_abi_cxx11_((string *)local_c0,(ByteData *)&local_50);
              ComparePsbtData(src_00,local_60,dest,local_68,local_78,(string *)local_c0,
                              SUB41(local_9c,0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._0_8_ != &local_b0) {
                operator_delete((void *)local_c0._0_8_);
              }
              if (local_50._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              bVar11 = true;
              bVar3 = false;
            }
          }
          src = local_58;
          if (!bVar3) break;
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar9 < local_58->num_items);
        dst = local_70;
        if (!bVar11) goto LAB_001be498;
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 < dst->num_items);
  }
  iVar4._M_current = iStack_90._M_current;
  puVar10 = local_98;
  iVar5 = local_cc;
  if (local_98 != iStack_90._M_current) {
    do {
      local_cc = iVar5;
      uVar2 = *puVar10;
      pwVar13 = dst->items;
      local_cc = wally_map_add(src,pwVar13[uVar2].key,pwVar13[uVar2].key_len,pwVar13[uVar2].value,
                               pwVar13[uVar2].value_len);
      if (local_cc != 0) {
        local_c0._0_8_ = "cfdcore_psbt.cpp";
        local_c0._8_4_ = 0x179;
        local_b0._M_allocated_capacity = 0x21e450;
        logger::log<int&>((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                          &local_cc);
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_50,"psbt add ",local_78);
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_c0._0_8_ = *plVar6;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._0_8_ == paVar8) {
          local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_b0._8_8_ = plVar6[3];
          local_c0._0_8_ = &local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_c0._8_8_ = plVar6[1];
        *plVar6 = (long)paVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CfdException::CfdException(pCVar7,kCfdMemoryFullError,(string *)local_c0);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      puVar10 = puVar10 + 1;
      iVar5 = 0;
    } while (puVar10 != iVar4._M_current);
    local_cc = wally_map_sort(src,0);
    if (local_cc != 0) {
      local_c0._0_8_ = "cfdcore_psbt.cpp";
      local_c0._8_4_ = 0x181;
      local_b0._M_allocated_capacity = 0x21e450;
      logger::log<int&>((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                        &local_cc);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c0._0_8_ = &local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"psbt sort map error.","");
      CfdException::CfdException(pCVar7,kCfdInternalError,(string *)local_c0);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  if (local_98 != (unsigned_long *)0x0) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void MergeWallyMap(
    struct wally_map *src, const struct wally_map *dst,
    const std::string &item_name, bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> regist_indexes;
  for (size_t dst_idx = 0; dst_idx < dst->num_items; ++dst_idx) {
    auto dst_item = &dst->items[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < src->num_items; ++src_idx) {
      auto src_item = &src->items[src_idx];
      if ((src_item->key_len == dst_item->key_len) &&
          (memcmp(src_item->key, dst_item->key, src_item->key_len) == 0)) {
        is_find = true;
        ByteData key(src_item->key, static_cast<uint32_t>(src_item->key_len));
        ComparePsbtData(
            src_item->value, src_item->value_len, dst_item->value,
            dst_item->value_len, item_name, key.GetHex(),
            ignore_duplicate_error);
        break;
      }
    }
    if (!is_find) regist_indexes.push_back(dst_idx);
  }
  if (!regist_indexes.empty()) {
    for (auto dst_idx : regist_indexes) {
      auto dst_item = &dst->items[dst_idx];
      ret = wally_map_add(
          src, dst_item->key, dst_item->key_len, dst_item->value,
          dst_item->value_len);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
        throw CfdException(
            kCfdMemoryFullError, "psbt add " + item_name + " error.");
      }
    }

    ret = wally_map_sort(src, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort map error.");
    }
  }
}